

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_builder.c
# Opt level: O0

int TryGetHexDigit(char **src,char *end)

{
  _Bool _Var1;
  char cVar2;
  char local_21;
  char *pcStack_20;
  char ch;
  char *end_local;
  char **src_local;
  
  pcStack_20 = end;
  end_local = (char *)src;
  _Var1 = TryGetChar(src,end,&local_21);
  if (_Var1) {
    if ((local_21 < '0') || ('9' < local_21)) {
      cVar2 = upb_ascii_lower(local_21);
      if ((cVar2 < 'a') || ('f' < cVar2)) {
        *(long *)end_local = *(long *)end_local + -1;
        src_local._4_4_ = -1;
      }
      else {
        src_local._4_4_ = cVar2 + -0x57;
      }
    }
    else {
      src_local._4_4_ = local_21 + -0x30;
    }
  }
  else {
    src_local._4_4_ = -1;
  }
  return src_local._4_4_;
}

Assistant:

static int TryGetHexDigit(const char** src, const char* end) {
  char ch;
  if (!TryGetChar(src, end, &ch)) return -1;
  if ('0' <= ch && ch <= '9') {
    return ch - '0';
  }
  ch = upb_ascii_lower(ch);
  if ('a' <= ch && ch <= 'f') {
    return ch - 'a' + 0xa;
  }
  *src -= 1;  // Char wasn't actually a hex digit.
  return -1;
}